

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O1

void Extra_PrintHexadecimal(FILE *pFile,uint *Sign,int nVars)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = 1 << ((byte)nVars & 0x1f);
  if (3 < (int)uVar2) {
    iVar3 = (uVar2 >> 2) + 1;
    uVar2 = uVar2 & 0xfffffffc;
    do {
      uVar2 = uVar2 - 4;
      uVar1 = Sign[iVar3 - 2U >> 3] >> ((byte)uVar2 & 0x1c) & 0xf;
      if (uVar1 < 10) {
        fprintf((FILE *)pFile,"%d");
      }
      else {
        fputc(uVar1 + 0x57,(FILE *)pFile);
      }
      iVar3 = iVar3 + -1;
    } while (1 < iVar3);
  }
  return;
}

Assistant:

void Extra_PrintHexadecimal( FILE * pFile, unsigned Sign[], int nVars )
{
    int nDigits, Digit, k;
    // write the number into the file
    nDigits = (1 << nVars) / 4;
    for ( k = nDigits - 1; k >= 0; k-- )
    {
        Digit = ((Sign[k/8] >> ((k%8) * 4)) & 15);
        if ( Digit < 10 )
            fprintf( pFile, "%d", Digit );
        else
            fprintf( pFile, "%c", 'a' + Digit-10 );
    }
//    fprintf( pFile, "\n" );
}